

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argParser.cpp
# Opt level: O0

void __thiscall AutoArgParse::FlagStore::parse(FlagStore *this,ArgIter *first,ArgIter *last)

{
  bool bVar1;
  MissingMandatoryFlagException *this_00;
  UnexpectedArgException *pUVar2;
  reference pbVar3;
  MissingMandatoryArgException *this_01;
  string local_88;
  undefined1 local_61;
  string local_60;
  Policy local_2c;
  int local_28;
  Policy foundPolicy;
  int numberParsedMandatoryArgs;
  int numberParsedMandatoryFlags;
  ArgIter *last_local;
  ArgIter *first_local;
  FlagStore *this_local;
  
  foundPolicy = MANDATORY;
  local_28 = 0;
  _numberParsedMandatoryArgs = last;
  last_local = first;
  first_local = (ArgIter *)this;
  while (bVar1 = __gnu_cxx::operator!=(last_local,_numberParsedMandatoryArgs), bVar1) {
    bVar1 = tryParseFlag(this,last_local,_numberParsedMandatoryArgs,&local_2c);
    if (bVar1) {
      if (local_2c == MANDATORY) {
        foundPolicy = foundPolicy + OPTIONAL;
      }
    }
    else {
      bVar1 = tryParseArg(this,last_local,_numberParsedMandatoryArgs,&local_2c);
      if (!bVar1) break;
      if (local_2c == MANDATORY) {
        local_28 = local_28 + 1;
      }
    }
  }
  if (foundPolicy != this->_numberMandatoryFlags) {
    bVar1 = __gnu_cxx::operator==(last_local,_numberParsedMandatoryArgs);
    if (bVar1) {
      this_00 = (MissingMandatoryFlagException *)__cxa_allocate_exception(0x38);
      MissingMandatoryFlagException::MissingMandatoryFlagException(this_00,this);
      __cxa_throw(this_00,&MissingMandatoryFlagException::typeinfo,
                  MissingMandatoryFlagException::~MissingMandatoryFlagException);
    }
    local_61 = 1;
    pUVar2 = (UnexpectedArgException *)__cxa_allocate_exception(0x58);
    pbVar3 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(last_local);
    std::__cxx11::string::string((string *)&local_60,(string *)pbVar3);
    UnexpectedArgException::UnexpectedArgException(pUVar2,&local_60,this);
    local_61 = 0;
    __cxa_throw(pUVar2,&UnexpectedArgException::typeinfo,
                UnexpectedArgException::~UnexpectedArgException);
  }
  if (local_28 != this->_numberMandatoryArgs) {
    bVar1 = __gnu_cxx::operator==(last_local,_numberParsedMandatoryArgs);
    if (bVar1) {
      this_01 = (MissingMandatoryArgException *)__cxa_allocate_exception(0x38);
      MissingMandatoryArgException::MissingMandatoryArgException(this_01,this);
      __cxa_throw(this_01,&MissingMandatoryArgException::typeinfo,
                  MissingMandatoryArgException::~MissingMandatoryArgException);
    }
    pUVar2 = (UnexpectedArgException *)__cxa_allocate_exception(0x58);
    pbVar3 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(last_local);
    std::__cxx11::string::string((string *)&local_88,(string *)pbVar3);
    UnexpectedArgException::UnexpectedArgException(pUVar2,&local_88,this);
    __cxa_throw(pUVar2,&UnexpectedArgException::typeinfo,
                UnexpectedArgException::~UnexpectedArgException);
  }
  return;
}

Assistant:

AUTOARGPARSE_INLINE void FlagStore::parse(ArgIter& first, ArgIter& last) {
    int numberParsedMandatoryFlags = 0;
    int numberParsedMandatoryArgs = 0;
    while (first != last) {
        Policy foundPolicy;
        if (tryParseFlag(first, last, foundPolicy)) {
            if (foundPolicy == Policy::MANDATORY) {
                numberParsedMandatoryFlags++;
            }
        } else if (tryParseArg(first, last, foundPolicy)) {
            if (foundPolicy == Policy::MANDATORY) {
                numberParsedMandatoryArgs++;
            }
        } else {
            break;
        }
    }
    if (numberParsedMandatoryFlags != _numberMandatoryFlags) {
        if (first == last) {
            throw MissingMandatoryFlagException(*this);
        } else {
            throw UnexpectedArgException(*first, *this);
        }
    }
    if (numberParsedMandatoryArgs != _numberMandatoryArgs) {
        if (first == last) {
            throw MissingMandatoryArgException(*this);
        } else {
            throw UnexpectedArgException(*first, *this);
        }
    }
}